

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

void deqp::gles3::Functional::evalTexture2DShadowProjGradOffset
               (ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Texture2D *pTVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  IVec3 local_1c;
  
  fVar5 = c->in[0].m_data[2];
  fVar1 = c->in[0].m_data[3];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  pTVar4 = c->textures[0].tex2D;
  fVar6 = (float)pTVar4->m_width;
  fVar7 = (float)pTVar4->m_height;
  fVar6 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * fVar6,c->in[1].m_data[1] * fVar7,
                     fVar6 * c->in[2].m_data[0],fVar7 * c->in[2].m_data[1]);
  local_1c.m_data._0_8_ = *(undefined8 *)(p->offset).m_data;
  pTVar4 = c->textures[0].tex2D;
  local_1c.m_data[2] = 0;
  fVar5 = tcu::sampleLevelArray2DCompare
                    ((pTVar4->m_view).m_levels,(pTVar4->m_view).m_numLevels,&c->textures[0].sampler,
                     fVar5 / fVar1,fVar2 / fVar1,fVar3 / fVar1,fVar6,&local_1c);
  (c->color).m_data[0] = fVar5;
  return;
}

Assistant:

static void		evalTexture2DShadowProjGradOffset	(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color.x() = texture2DShadowOffset(c, c.in[0].z()/c.in[0].w(), c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), computeLodFromGrad2D(c), p.offset.swizzle(0,1)); }